

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O1

offset_datetime_type * __thiscall
toml::basic_value<toml::type_config>::as_offset_datetime(basic_value<toml::type_config> *this)

{
  string local_38;
  
  if (this->type_ == offset_datetime) {
    return (offset_datetime_type *)&this->field_1;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"toml::value::as_offset_datetime()","");
  throw_bad_cast(this,&local_38,offset_datetime);
}

Assistant:

offset_datetime_type const& as_offset_datetime() const
    {
        if(this->type_ != value_t::offset_datetime)
        {
            this->throw_bad_cast("toml::value::as_offset_datetime()", value_t::offset_datetime);
        }
        return this->offset_datetime_.value;
    }